

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::lookupValue
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,string *variable)

{
  bool bVar1;
  iterator iVar2;
  type_info *ptVar3;
  _Base_ptr this_00;
  SelectionSet bs;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> local_50;
  SelectionSet local_38;
  
  createSelectionSets(&bs,this);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::find(&(this->variables)._M_t,variable);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->variables)._M_t._M_impl.super__Rb_tree_header) {
    unrecognizedIdentifier(this,variable);
  }
  else {
    this_00 = iVar2._M_node + 2;
    ptVar3 = std::any::type((any *)this_00);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&SelectionSet::typeinfo);
    if (bVar1) {
      std::any_cast<OpenMD::SelectionSet>(__return_storage_ptr__,(any *)this_00);
      goto LAB_002196da;
    }
    ptVar3 = std::any::type((any *)this_00);
    bVar1 = std::type_info::operator==
                      (ptVar3,(type_info *)
                              &std::vector<OpenMD::Token,std::allocator<OpenMD::Token>>::typeinfo);
    if (bVar1) {
      std::any_cast<std::vector<OpenMD::Token,std::allocator<OpenMD::Token>>>
                (&local_50,(any *)this_00);
      expression(&local_38,this,&local_50,2);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
                (&bs.bitsets_,&local_38);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_38.bitsets_);
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector(&local_50);
      std::any::operator=((any *)this_00,&bs);
    }
  }
  SelectionSet::parallelReduce(__return_storage_ptr__,&bs);
LAB_002196da:
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&bs.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::lookupValue(const std::string& variable) {
    SelectionSet bs                             = createSelectionSets();
    std::map<std::string, std::any>::iterator i = variables.find(variable);

    if (i != variables.end()) {
      if (i->second.type() == typeid(SelectionSet)) {
        return std::any_cast<SelectionSet>(i->second);
      } else if (i->second.type() == typeid(std::vector<Token>)) {
        bs        = expression(std::any_cast<std::vector<Token>>(i->second), 2);
        i->second = bs; /**@todo fixme */
        return bs.parallelReduce();
      }
    } else {
      unrecognizedIdentifier(variable);
    }

    return bs.parallelReduce();
  }